

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSCriticalSection.h
# Opt level: O2

int InitCriticalSection(CRITICAL_SECTION *pCriticalSection)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pthread_mutexattr_t attr;
  
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  if (iVar1 == 0) {
    iVar1 = 1;
    iVar2 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    if (iVar2 == 0) {
      iVar2 = pthread_mutex_init((pthread_mutex_t *)pCriticalSection,(pthread_mutexattr_t *)&attr);
      iVar3 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
      if (iVar2 == 0) {
        if (iVar3 == 0) {
          iVar1 = 0;
        }
        else {
          pthread_mutex_destroy((pthread_mutex_t *)pCriticalSection);
        }
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int InitCriticalSection(CRITICAL_SECTION* pCriticalSection)
{
#ifdef _WIN32
#ifndef WINCE
	if (!InitializeCriticalSectionAndSpinCount(pCriticalSection, 32))
	{
		PRINT_DEBUG_ERROR_OSCRITICALSECTION(("InitCriticalSection error (%s) : %s\n", 
			strtime_m(), GetLastErrorMsg()));
		return EXIT_FAILURE;
	}
#else
	InitializeCriticalSection(pCriticalSection);
#endif // !WINCE
#else 
	pthread_mutexattr_t attr;

	if (pthread_mutexattr_init(&attr) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCRITICALSECTION(("InitCriticalSection error (%s) : %s\n", 
			strtime_m(), "pthread_mutexattr_init failed. "));
		return EXIT_FAILURE;
	}

	// A thread attempting to relock this mutex without first unlocking it shall succeed in 
	// locking the mutex. The relocking deadlock which can occur with mutexes of type 
	// PTHREAD_MUTEX_NORMAL cannot occur with this type of mutex. Multiple locks of this mutex 
	// shall require the same number of unlocks to release the mutex before another thread can 
	// acquire the mutex. A thread attempting to unlock a mutex which another thread has locked 
	// shall return with an error. A thread attempting to unlock an unlocked mutex shall return 
	// with an error. 
	// This is similar to the behaviour of the Windows critical section objects.
	if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCRITICALSECTION(("InitCriticalSection error (%s) : %s\n", 
			strtime_m(), "pthread_mutexattr_settype failed. "));
		pthread_mutexattr_destroy(&attr);
		return EXIT_FAILURE;
	}

	if (pthread_mutex_init(pCriticalSection, &attr) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCRITICALSECTION(("InitCriticalSection error (%s) : %s\n", 
			strtime_m(), "pthread_mutex_init failed. "));
		pthread_mutexattr_destroy(&attr);
		return EXIT_FAILURE;
	}

	if (pthread_mutexattr_destroy(&attr) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCRITICALSECTION(("InitCriticalSection error (%s) : %s\n", 
			strtime_m(), "pthread_mutexattr_destroy failed. "));
		pthread_mutex_destroy(pCriticalSection);
		return EXIT_FAILURE;
	}
#endif // _WIN32
	return EXIT_SUCCESS;
}